

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::runCurrentTest(RunContext *this,string *redirectedCout,string *redirectedCerr)

{
  bool bVar1;
  uint uVar2;
  IStreamingReporter *pIVar3;
  SourceLineInfo *_lineInfo;
  IConfig *config;
  ostream *poVar4;
  undefined1 local_758 [8];
  SectionStats testCaseSectionStats;
  undefined1 local_6d0 [7];
  bool missingAssertions;
  Counts assertions;
  TestFailureException *anon_var_0;
  undefined1 local_480 [8];
  StreamRedirect cerrRedir;
  StreamRedirect coutRedir;
  Timer local_158;
  Timer timer;
  allocator local_129;
  string local_128;
  AssertionInfo local_108;
  double local_b0;
  double duration;
  Counts prevAssertions;
  undefined1 local_78 [8];
  SectionInfo testCaseSection;
  TestCaseInfo *testCaseInfo;
  string *redirectedCerr_local;
  string *redirectedCout_local;
  RunContext *this_local;
  
  testCaseSection.lineInfo.line = (size_t)TestCase::getTestCaseInfo(this->m_activeTestCase);
  SectionInfo::SectionInfo
            ((SectionInfo *)local_78,&((TestCaseInfo *)testCaseSection.lineInfo.line)->lineInfo,
             (string *)testCaseSection.lineInfo.line,
             &((TestCaseInfo *)testCaseSection.lineInfo.line)->description);
  pIVar3 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[9])(pIVar3,local_78);
  prevAssertions.failed = (this->m_totals).assertions.failedButOk;
  duration = (double)(this->m_totals).assertions.passed;
  prevAssertions.passed = (this->m_totals).assertions.failed;
  local_b0 = 0.0;
  this->m_shouldReportUnexpected = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"TEST_CASE",&local_129);
  _lineInfo = (SourceLineInfo *)(testCaseSection.lineInfo.line + 0xe0);
  std::__cxx11::string::string((string *)&timer);
  AssertionInfo::AssertionInfo(&local_108,&local_128,_lineInfo,(string *)&timer,Normal);
  AssertionInfo::operator=(&this->m_lastAssertionInfo,&local_108);
  AssertionInfo::~AssertionInfo(&local_108);
  std::__cxx11::string::~string((string *)&timer);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  config = Ptr<const_Catch::IConfig>::operator*(&this->m_config);
  seedRng(config);
  Timer::Timer(&local_158);
  Timer::start(&local_158);
  pIVar3 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  uVar2 = (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[4])();
  if ((uVar2 & 1) == 0) {
    invokeActiveTestCase(this);
  }
  else {
    poVar4 = cout();
    StreamRedirect::StreamRedirect
              ((StreamRedirect *)&cerrRedir.m_targetString,poVar4,redirectedCout);
    poVar4 = cerr();
    StreamRedirect::StreamRedirect((StreamRedirect *)local_480,poVar4,redirectedCerr);
    invokeActiveTestCase(this);
    StreamRedirect::~StreamRedirect((StreamRedirect *)local_480);
    StreamRedirect::~StreamRedirect((StreamRedirect *)&cerrRedir.m_targetString);
  }
  local_b0 = Timer::getElapsedSeconds(&local_158);
  (*(this->m_testCaseTracker->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
    _vptr_NonCopyable[10])();
  handleUnfinishedSections(this);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear(&this->m_messages);
  Counts::operator-((Counts *)local_6d0,&(this->m_totals).assertions,(Counts *)&duration);
  testCaseSectionStats._127_1_ = testForMissingAssertions(this,(Counts *)local_6d0);
  bVar1 = TestCaseInfo::okToFail((TestCaseInfo *)testCaseSection.lineInfo.line);
  if (bVar1) {
    std::swap<unsigned_long>(&assertions.failed,&assertions.passed);
    (this->m_totals).assertions.failed = (this->m_totals).assertions.failed - assertions.failed;
    (this->m_totals).assertions.failedButOk =
         assertions.failed + (this->m_totals).assertions.failedButOk;
  }
  SectionStats::SectionStats
            ((SectionStats *)local_758,(SectionInfo *)local_78,(Counts *)local_6d0,local_b0,
             (bool)(testCaseSectionStats._127_1_ & 1));
  pIVar3 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar3,local_758);
  SectionStats::~SectionStats((SectionStats *)local_758);
  SectionInfo::~SectionInfo((SectionInfo *)local_78);
  return;
}

Assistant:

void runCurrentTest( std::string& redirectedCout, std::string& redirectedCerr ) {
            TestCaseInfo const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
            SectionInfo testCaseSection( testCaseInfo.lineInfo, testCaseInfo.name, testCaseInfo.description );
            m_reporter->sectionStarting( testCaseSection );
            Counts prevAssertions = m_totals.assertions;
            double duration = 0;
            m_shouldReportUnexpected = true;
            try {
                m_lastAssertionInfo = AssertionInfo( "TEST_CASE", testCaseInfo.lineInfo, std::string(), ResultDisposition::Normal );

                seedRng( *m_config );

                Timer timer;
                timer.start();
                if( m_reporter->getPreferences().shouldRedirectStdOut ) {
                    StreamRedirect coutRedir( Catch::cout(), redirectedCout );
                    StreamRedirect cerrRedir( Catch::cerr(), redirectedCerr );
                    invokeActiveTestCase();
                }
                else {
                    invokeActiveTestCase();
                }
                duration = timer.getElapsedSeconds();
            }
            catch( TestFailureException& ) {
                // This just means the test was aborted due to failure
            }
            catch(...) {
                // Under CATCH_CONFIG_FAST_COMPILE, unexpected exceptions under REQUIRE assertions
                // are reported without translation at the point of origin.
                if (m_shouldReportUnexpected) {
                    makeUnexpectedResultBuilder().useActiveException();
                }
            }
            m_testCaseTracker->close();
            handleUnfinishedSections();
            m_messages.clear();

            Counts assertions = m_totals.assertions - prevAssertions;
            bool missingAssertions = testForMissingAssertions( assertions );

            if( testCaseInfo.okToFail() ) {
                std::swap( assertions.failedButOk, assertions.failed );
                m_totals.assertions.failed -= assertions.failedButOk;
                m_totals.assertions.failedButOk += assertions.failedButOk;
            }

            SectionStats testCaseSectionStats( testCaseSection, assertions, duration, missingAssertions );
            m_reporter->sectionEnded( testCaseSectionStats );
        }